

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O3

void __thiscall
HW_HeadLossModel::findHeadLoss
          (HW_HeadLossModel *this,Pipe *pipe,double flow,double *headLoss,double *gradient)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double __x;
  
  __x = ABS(flow);
  dVar3 = pipe->resistance;
  dVar1 = pipe->lossFactor;
  dVar2 = pow(__x,0.8520000000000001);
  dVar2 = dVar2 * dVar3 * 1.852;
  *gradient = dVar2;
  if (1e-06 <= dVar2) {
    dVar3 = (dVar2 * __x) / 1.852;
  }
  else {
    *gradient = 1e-06;
    dVar3 = __x * 1e-06;
  }
  *headLoss = dVar3;
  if (0.0 < dVar1) {
    *headLoss = __x * dVar1 * __x + dVar3;
    *gradient = (dVar1 + dVar1) * __x + *gradient;
  }
  if (flow < 0.0) {
    *headLoss = -*headLoss;
  }
  return;
}

Assistant:

void HW_HeadLossModel::findHeadLoss(Pipe* pipe, double flow, double& headLoss,
    double& gradient)
{
    double q = abs(flow);
    double r = pipe->resistance;
    double k = pipe->lossFactor;

    gradient = HW_EXP * r * pow(q, HW_EXP-1.0);
    if ( gradient < MIN_GRADIENT )
    {
        gradient = MIN_GRADIENT;
        headLoss = q * gradient;
    }
    else headLoss = q * gradient / HW_EXP;
    if (k > 0.0)
    {
        headLoss += k * q * q;
        gradient += 2.0 * k * q;
   	}

    // ... give proper sign to head loss

    if (flow < 0.0) headLoss = -headLoss;
}